

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

void secp256k1_dleq_challenge
               (secp256k1_scalar *e,secp256k1_ge *gen2,secp256k1_ge *r1,secp256k1_ge *r2,
               secp256k1_ge *p1,secp256k1_ge *p2)

{
  undefined1 local_c0 [8];
  secp256k1_sha256 sha;
  uchar buf [32];
  secp256k1_ge *p2_local;
  secp256k1_ge *p1_local;
  secp256k1_ge *r2_local;
  secp256k1_ge *r1_local;
  secp256k1_ge *gen2_local;
  secp256k1_scalar *e_local;
  
  secp256k1_nonce_function_dleq_sha256_tagged((secp256k1_sha256 *)local_c0);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_c0,p1);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_c0,gen2);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_c0,p2);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_c0,r1);
  secp256k1_dleq_hash_point((secp256k1_sha256 *)local_c0,r2);
  secp256k1_sha256_finalize((secp256k1_sha256 *)local_c0,(uchar *)&sha.bytes);
  secp256k1_scalar_set_b32(e,(uchar *)&sha.bytes,(int *)0x0);
  return;
}

Assistant:

static void secp256k1_dleq_challenge(secp256k1_scalar *e, secp256k1_ge *gen2, secp256k1_ge *r1, secp256k1_ge *r2, secp256k1_ge *p1, secp256k1_ge *p2) {
    unsigned char buf[32];
    secp256k1_sha256 sha;

    secp256k1_nonce_function_dleq_sha256_tagged(&sha);
    secp256k1_dleq_hash_point(&sha, p1);
    secp256k1_dleq_hash_point(&sha, gen2);
    secp256k1_dleq_hash_point(&sha, p2);
    secp256k1_dleq_hash_point(&sha, r1);
    secp256k1_dleq_hash_point(&sha, r2);
    secp256k1_sha256_finalize(&sha, buf);

    secp256k1_scalar_set_b32(e, buf, NULL);
}